

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  uint uVar1;
  uint uVar2;
  U32 UVar3;
  
  if (optPtr->literalCompressionMode != ZSTD_ps_disable) {
    uVar2 = optPtr->litSum + 1;
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (optLevel == 0) {
      UVar3 = uVar1 << 8;
    }
    else {
      if (0x16 < uVar1) goto LAB_001cf8d0;
      UVar3 = (uVar2 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
    }
    optPtr->litSumBasePrice = UVar3;
  }
  uVar2 = optPtr->litLengthSum + 1;
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (optLevel == 0) {
    UVar3 = uVar1 << 8;
  }
  else {
    if (0x16 < uVar1) goto LAB_001cf8d0;
    UVar3 = (uVar2 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  uVar2 = optPtr->matchLengthSum + 1;
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  optPtr->litLengthSumBasePrice = UVar3;
  if (optLevel == 0) {
    UVar3 = uVar1 << 8;
  }
  else {
    if (0x16 < uVar1) goto LAB_001cf8d0;
    UVar3 = (uVar2 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  uVar2 = optPtr->offCodeSum + 1;
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  optPtr->matchLengthSumBasePrice = UVar3;
  if (optLevel == 0) {
    UVar3 = uVar1 << 8;
  }
  else {
    if (0x16 < uVar1) {
LAB_001cf8d0:
      __assert_fail("hb + BITCOST_ACCURACY < 31",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7f60,"U32 ZSTD_fracWeight(U32)");
    }
    UVar3 = (uVar2 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  optPtr->offCodeSumBasePrice = UVar3;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}